

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc.c
# Opt level: O0

void sc_export(uint8_t *dst,limb_t *x)

{
  limb_t *in_RDI;
  limb_t *unaff_retaddr;
  int i;
  int fill;
  uint64_t foo;
  sc_t tmp;
  uint8_t *endp;
  int local_58;
  int local_54;
  ulong local_50;
  long local_48 [6];
  limb_t *local_18;
  
  local_18 = in_RDI + 4;
  sc_reduce(unaff_retaddr,in_RDI);
  local_50 = 0;
  local_54 = 0;
  for (local_58 = 0; local_58 < 5; local_58 = local_58 + 1) {
    local_50 = local_48[local_58] << ((byte)local_54 & 0x3f) | local_50;
    for (local_54 = local_54 + 0x34; 7 < local_54 && in_RDI < local_18; local_54 = local_54 + -8) {
      *(char *)in_RDI = (char)local_50;
      local_50 = local_50 >> 8;
      in_RDI = (limb_t *)((long)in_RDI + 1);
    }
  }
  return;
}

Assistant:

void
sc_export(uint8_t dst[32], const sc_t x)
{
	const uint8_t *endp = dst+32;
	sc_t tmp;
	uint64_t foo;
	int fill, i;

	sc_reduce(tmp, x);

	for (i = 0, foo = 0, fill = 0; i < K; i++) {
		foo |= (uint64_t)tmp[i] << fill;
		for (fill += LB; fill >= 8 && dst < endp; fill -= 8, foo >>= 8)
			*dst++ = foo & 0xff;
	}
}